

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

void write_parser_tables_internal
               (Grammar *g,char *base_pathname,char *tag,int binary,FILE *fp,uint8 **str,
               uint *str_len)

{
  char *start;
  byte bVar1;
  Production *pPVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  FILE *__stream;
  size_t sVar11;
  FILE *__stream_00;
  Code *pCVar12;
  ushort **ppuVar13;
  D_Pass *pDVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  Term *pTVar18;
  char *pcVar19;
  uint uVar20;
  char *end;
  long lVar21;
  FILE *local_11d0;
  File file;
  char local_10b8 [128];
  char ver [128];
  
  local_11d0 = (FILE *)fp;
  if ((binary == 0) && (local_11d0 = fopen(g->write_pathname,"w"), local_11d0 == (FILE *)0x0)) {
    local_11d0 = (FILE *)0x0;
    d_fail("unable to open `%s` for write\n");
  }
  if (*g->actions_write_pathname == '\0') {
    __stream = (FILE *)0x0;
  }
  else {
    __stream = fopen(g->actions_write_pathname,"w");
    if (__stream == (FILE *)0x0) {
      __stream = (FILE *)0x0;
      d_fail("unable to open `%s` for write\n");
    }
  }
  memset(&file,0,0xf0);
  file.fp = (FILE *)local_11d0;
  file.str_len = str_len;
  file.binary = binary;
  file.actions_fp = (FILE *)__stream;
  file.str = str;
  if (binary != 0) {
    file.tables.len = 0x400;
    file.tables.start = (char *)calloc(1,0x400);
    file.strings.len = 0x400;
    file.tables.cur = file.tables.start;
    file.strings.start = (char *)calloc(1,0x400);
    file.strings.cur = file.strings.start;
  }
  file.relocations.n = 0;
  file.relocations.v = (char **)0x0;
  file.entries.n = 0;
  file.entries.v = (OffsetEntry **)0x0;
  file.str_relocations.n = 0;
  file.str_relocations.v = (char **)0x0;
  if (binary == 0) {
    bVar3 = true;
    bVar4 = false;
    for (uVar16 = 0; (g->terminals).n != uVar16; uVar16 = uVar16 + 1) {
      if ((g->terminals).v[uVar16]->kind == TERM_TOKEN) {
        bVar4 = true;
      }
    }
    if (g->states_for_all_nterms == 0) {
      bVar3 = false;
      for (uVar20 = 0; uVar20 < (g->productions).n; uVar20 = uVar20 + 1) {
        uVar8 = state_for_declaration(g,uVar20);
        if (uVar8 != 0) {
          bVar3 = true;
        }
      }
    }
    if ((0 < g->write_header) || ((bVar5 = true, g->write_header < 0 && (bVar4 || bVar3)))) {
      strcpy(ver,base_pathname);
      sVar11 = strlen(ver);
      builtin_strncpy(ver + sVar11,".d_parser.h",0xc);
      __stream_00 = fopen(ver,"w");
      if (__stream_00 == (FILE *)0x0) {
        d_fail("unable to open `%s` for write\n",ver);
      }
      d_version(local_10b8);
      myfprintf((FILE *)__stream_00,"/*\n  Generated by Make DParser Version %s\n",local_10b8);
      myfprintf((FILE *)__stream_00,"  Available at https://github.com/jplevyak/dparser\n*/\n\n");
      myfprintf((FILE *)__stream_00,"#ifndef _%s_h\n",tag);
      myfprintf((FILE *)__stream_00,"#define _%s_h\n",tag);
      if (bVar4) {
        if (g->token_type == 0) {
          for (uVar16 = 0; uVar16 < (g->terminals).n; uVar16 = uVar16 + 1) {
            pTVar18 = (g->terminals).v[uVar16];
            if (pTVar18->kind == TERM_TOKEN) {
              myfprintf((FILE *)__stream_00,"#define %s \t%d\n",pTVar18->string,
                        (ulong)((g->productions).n + pTVar18->index));
            }
          }
        }
        else {
          myfprintf((FILE *)__stream_00,"enum D_Tokens_%s {\n",tag);
          uVar20 = 0;
          for (uVar16 = 0; uVar7 = (g->terminals).n, uVar16 < uVar7; uVar16 = uVar16 + 1) {
            pTVar18 = (g->terminals).v[uVar16];
            if (pTVar18->kind == TERM_TOKEN) {
              uVar20 = uVar20 + pTVar18->string_len + 7;
              if (0x46 < uVar20) {
                putchar(10);
                pTVar18 = (g->terminals).v[uVar16];
                uVar7 = (g->terminals).n;
                uVar20 = 0;
              }
              pcVar19 = ", ";
              if (uVar16 == uVar7 - 1) {
                pcVar19 = "";
              }
              myfprintf((FILE *)__stream_00,"%s = %d%s",pTVar18->string,
                        (ulong)((g->productions).n + pTVar18->index),pcVar19);
            }
          }
          myfprintf((FILE *)__stream_00,"\n};\n");
        }
      }
      if (bVar3) {
        for (uVar16 = 0; uVar16 < (g->productions).n; uVar16 = uVar16 + 1) {
          pPVar2 = (g->productions).v[uVar16];
          if (((pPVar2->field_0x3c & 0x1c) == 0) && (pPVar2->elem != (Elem *)0x0)) {
            myfprintf((FILE *)__stream_00,"#define D_START_STATE_%s \t%d\n",pPVar2->name,
                      (ulong)pPVar2->state->index);
          }
        }
      }
      bVar5 = false;
      myfprintf((FILE *)__stream_00,"#endif\n");
      fclose(__stream_00);
    }
    d_version(ver);
    myfprintf((FILE *)local_11d0,"/*\n  Generated by Make DParser Version %s\n",ver);
    myfprintf((FILE *)local_11d0,"  Available at https://github.com/jplevyak/dparser\n*/\n\n");
    g->write_line = 7;
    if (__stream == (FILE *)0x0) {
      __stream = local_11d0;
    }
    uVar16 = 7;
    uVar17 = 0;
LAB_00136358:
    if (uVar17 < g->ncode) {
      pCVar12 = g->code;
      pcVar19 = pCVar12[uVar17].code;
      if (g->write_line_directives == 0) {
        if (file.actions_fp == (FILE *)0x0) goto LAB_00136402;
        pCVar12 = g->code;
      }
      else if (file.actions_fp == (FILE *)0x0) {
        myfprintf((FILE *)__stream,"#line %d \"%s\"\n",(ulong)(uint)pCVar12[uVar17].line,g->pathname
                 );
        g->write_line = g->write_line + 1;
        goto LAB_00136402;
      }
      uVar20 = pCVar12[uVar17].line;
      pcVar15 = g->pathname;
      iVar9 = count_newlines(pcVar19);
      myfprintf((FILE *)__stream,"%d \"%s\" %d\n",(ulong)uVar20,pcVar15,(ulong)(iVar9 + 1));
LAB_00136402:
      cVar6 = *pcVar19;
      if (cVar6 == '\n') {
        g->write_line = g->write_line + 1;
        cVar6 = *pcVar19;
      }
      else if (cVar6 == '\0') goto LAB_001365f5;
      if (cVar6 == '$') {
        iVar9 = (int)uVar17;
        if (pcVar19[1] == '{') {
          pcVar15 = pcVar19 + 2;
          pcVar19 = pcVar19 + 3;
          lVar21 = 0;
          while( true ) {
            bVar1 = pcVar15[lVar21];
            if (((bVar1 == 0) || (bVar1 == 0x7d)) ||
               (ppuVar13 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar13 + (ulong)bVar1 * 2 + 1) & 0x20) != 0)) break;
            lVar21 = lVar21 + 1;
            pcVar19 = pcVar19 + 1;
          }
          ppuVar13 = __ctype_b_loc();
          uVar20 = (*ppuVar13)[bVar1] >> 0xd & 1;
          start = pcVar15 + lVar21;
          pcVar19 = pcVar19 + uVar20;
          for (end = start + uVar20; (*end != '\0' && (*end != '}')); end = end + 1) {
            pcVar19 = pcVar19 + 1;
          }
          if (lVar21 == 4) {
            iVar10 = strncasecmp(pcVar15,"pass",4);
            if (iVar10 != 0) goto LAB_00136556;
            pDVar14 = find_pass(g,start,end);
            if (pDVar14 == (D_Pass *)0x0) {
              pcVar15 = dup_str(start,end);
              d_fail("unknown pass \'%s\' line %d",pcVar15,
                     (ulong)(uint)(g->code[uVar17].line + iVar9));
            }
            uVar20 = pDVar14->index;
LAB_001365e4:
            myfprintf((FILE *)__stream,"%d",(ulong)uVar20);
          }
          else {
            if (lVar21 == 6) {
              iVar10 = strncasecmp(pcVar15,"string",6);
              if (iVar10 == 0) {
                iVar9 = 4;
                goto LAB_00136526;
              }
            }
            else if ((lVar21 == 5) && (iVar10 = strncasecmp(pcVar15,"nterm",5), iVar10 == 0)) {
              iVar9 = 1;
LAB_00136526:
              uVar20 = find_symbol(g,start,end,iVar9);
              goto LAB_001365e4;
            }
LAB_00136556:
            d_fail("bad $ escape in code line %u\n",(ulong)(uint)(g->code[uVar17].line + iVar9));
          }
        }
        else {
          pcVar19 = pcVar19 + 1;
          d_fail("bad $ escape in code line %u\n",(ulong)(uint)(g->code[uVar17].line + iVar9));
        }
      }
      else {
        fputc((int)cVar6,__stream);
        pcVar19 = pcVar19 + 1;
      }
      goto LAB_00136402;
    }
    if ((g->write_line_directives != 0) && (file.actions_fp == (FILE *)0x0)) {
      myfprintf((FILE *)__stream,"#line %d \"%s\"\n",uVar16,g->write_pathname);
      g->write_line = g->write_line + 1;
    }
    myfprintf((FILE *)local_11d0,"#include \"stdlib.h\"\n");
    myfprintf((FILE *)local_11d0,"#include \"dparse.h\"\n");
    g->write_line = g->write_line + 1;
    if (!bVar5) {
      myfprintf((FILE *)local_11d0,"#include \"%s.d_parser.h\"\n",base_pathname);
      g->write_line = g->write_line + 1;
    }
    myfprintf((FILE *)local_11d0,"\n");
    g->write_line = g->write_line + 1;
  }
  write_parser_tables(g,tag,&file);
  return;
LAB_001365f5:
  myfprintf((FILE *)__stream,"\n");
  uVar20 = g->write_line + 1;
  uVar16 = (ulong)uVar20;
  g->write_line = uVar20;
  uVar17 = uVar17 + 1;
  goto LAB_00136358;
}

Assistant:

void write_parser_tables_internal(Grammar *g, char *base_pathname, char *tag, int binary, FILE *fp, uint8 **str,
                                  uint *str_len) {
  File file;
  FILE *actions_fp = NULL;
  if (!binary) {
    fp = fopen(g->write_pathname, "w");
    if (!fp) d_fail("unable to open `%s` for write\n", g->write_pathname);
  }
  if (g->actions_write_pathname[0]) {
    actions_fp = fopen(g->actions_write_pathname, "w");
    if (!actions_fp) d_fail("unable to open `%s` for write\n", g->actions_write_pathname);
  }
  file_init(&file, binary, fp, actions_fp, str, str_len);
  if (!binary) {
    char ver[128];
    int header = write_header(g, base_pathname, tag);
    d_version(ver);
    fprintf(fp, "/*\n  Generated by Make DParser Version %s\n", ver);
    fprintf(fp, "  Available at https://github.com/jplevyak/dparser\n*/\n\n");
    g->write_line = 7;
    write_global_code(&file, g, tag);
    fprintf(fp, "#include \"stdlib.h\"\n");
    fprintf(fp, "#include \"dparse.h\"\n");
    g->write_line++;

    if (header) {
      fprintf(fp, "#include \"%s.d_parser.h\"\n", base_pathname);
      g->write_line++;
    }
    fprintf(fp, "\n");
    g->write_line++;
  }
  write_parser_tables(g, tag, &file);
}